

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void start_reboot(CHAR_DATA *ch)

{
  char *pcVar1;
  char *pcVar2;
  CHAR_DATA *in_RDI;
  char *__end;
  char buf [4608];
  CHAR_DATA *local_1270;
  string local_1268;
  string local_1248;
  char local_1228 [4616];
  
  if (reboot_num == 0) {
    reboot_now(in_RDI);
    return;
  }
  if (reboot_num == -1) {
    rebooting = false;
    do_echo(in_RDI,"*** REBOOT CANCELLED ***");
    return;
  }
  if ((reboot_num < 6) || ((uint)reboot_num % 5 == 0)) {
    local_1270 = in_RDI;
    pcVar1 = int_to_cap_string(reboot_num);
    pcVar2 = "S";
    if (reboot_num == 1) {
      pcVar2 = "";
    }
    sprintf(local_1228,"*** REBOOT IN %s MINUTE%s ***",pcVar1,pcVar2);
    do_echo(local_1270,local_1228);
    reboot_num = reboot_num + -1;
    local_1248._M_dataplus._M_p = (pointer)&local_1248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1248,"start_reboot","");
    local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1268,"start_reboot","");
    CQueue::AddToQueue<void(*)(char_data*),char_data*&>
              (&RS.Queue,0x3c,&local_1248,&local_1268,start_reboot,&local_1270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
      operator_delete(local_1268._M_dataplus._M_p,local_1268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
      operator_delete(local_1248._M_dataplus._M_p,local_1248.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void start_reboot(CHAR_DATA *ch)
{
	char buf[MSL];

	if (reboot_num == -1)
	{
		rebooting = false;
		do_echo(ch, "*** REBOOT CANCELLED ***");
	}
	else if (reboot_num == 0)
	{
		reboot_now(ch);
	}
	else
	{
		if (reboot_num < 6 || (reboot_num % 5 == 0))
		{
			sprintf(buf, "*** REBOOT IN %s MINUTE%s ***", int_to_cap_string(reboot_num), (reboot_num == 1) ? "" : "S");
			do_echo(ch, buf);

			reboot_num--;
			RS.Queue.AddToQueue(60, "start_reboot", "start_reboot", start_reboot, ch);
		}
	}
}